

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

uint32_t __thiscall wasm::WasmBinaryWriter::getSignatureIndex(WasmBinaryWriter *this,Signature sig)

{
  const_iterator cVar1;
  ostream *poVar2;
  Type in_RCX;
  Signature sig_00;
  undefined1 local_18 [8];
  Signature sig_local;
  
  sig_local.params = sig.results.id;
  local_18 = (undefined1  [8])sig.params.id;
  cVar1 = std::
          _Hashtable<wasm::Signature,_std::pair<const_wasm::Signature,_unsigned_int>,_std::allocator<std::pair<const_wasm::Signature,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Signature>,_std::hash<wasm::Signature>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->signatureIndexes)._M_h,(key_type *)local_18);
  if (cVar1.super__Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true>._M_cur
      != (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true>.
                   _M_cur + 0x18);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Missing signature: ");
  sig_00.results.id = in_RCX.id;
  sig_00.params.id = sig_local.params.id;
  poVar2 = wasm::operator<<((wasm *)poVar2,(ostream *)local_18,sig_00);
  std::operator<<(poVar2,'\n');
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x2e1,"uint32_t wasm::WasmBinaryWriter::getSignatureIndex(Signature) const");
}

Assistant:

uint32_t WasmBinaryWriter::getSignatureIndex(Signature sig) const {
  auto it = signatureIndexes.find(sig);
#ifndef NDEBUG
  if (it == signatureIndexes.end()) {
    std::cout << "Missing signature: " << sig << '\n';
    assert(0);
  }
#endif
  return it->second;
}